

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstant
               (uint constant,idx_t count,void *data_ptr,bool all_invalid)

{
  uint *puVar1;
  
  ReserveSpace((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,4);
  WriteMetaData((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,CONSTANT);
  puVar1 = *(uint **)((long)data_ptr + 0x40);
  *puVar1 = constant;
  *(uint **)((long)data_ptr + 0x40) = puVar1 + 1;
  UpdateStats((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}